

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O2

void llvm::yaml::MappingTraits<llvm::DWARFYAML::Unit>::mapping(IO *IO,Unit *Unit)

{
  yaml::IO::mapRequired<llvm::DWARFYAML::InitialLength>(IO,"Length",&Unit->Length);
  yaml::IO::mapRequired<unsigned_short>(IO,"Version",&Unit->Version);
  if (4 < Unit->Version) {
    yaml::IO::mapRequired<llvm::dwarf::UnitType>(IO,"UnitType",&Unit->Type);
  }
  yaml::IO::mapRequired<unsigned_int>(IO,"AbbrOffset",&Unit->AbbrOffset);
  yaml::IO::mapRequired<unsigned_char>(IO,"AddrSize",&Unit->AddrSize);
  yaml::IO::mapOptional<std::vector<llvm::DWARFYAML::Entry,std::allocator<llvm::DWARFYAML::Entry>>>
            (IO,"Entries",&Unit->Entries);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::Unit>::mapping(IO &IO, DWARFYAML::Unit &Unit) {
  IO.mapRequired("Length", Unit.Length);
  IO.mapRequired("Version", Unit.Version);
  if (Unit.Version >= 5)
    IO.mapRequired("UnitType", Unit.Type);
  IO.mapRequired("AbbrOffset", Unit.AbbrOffset);
  IO.mapRequired("AddrSize", Unit.AddrSize);
  IO.mapOptional("Entries", Unit.Entries);
}